

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

tm * pstore::gm_time(time_t clock)

{
  int *piVar1;
  tm *ptVar2;
  tm *in_RDI;
  time_t local_20;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  in_RDI->tm_sec = 0;
  in_RDI->tm_min = 0;
  in_RDI->tm_hour = 0;
  in_RDI->tm_mday = 0;
  in_RDI->tm_mon = 0;
  in_RDI->tm_year = 0;
  in_RDI->tm_wday = 0;
  in_RDI->tm_yday = 0;
  *(undefined8 *)&in_RDI->tm_isdst = 0;
  in_RDI->tm_gmtoff = 0;
  in_RDI->tm_zone = (char *)0x0;
  ptVar2 = gmtime_r(&local_20,in_RDI);
  if (ptVar2 == (tm *)0x0) {
    raise<pstore::errno_erc,char[9]>((errno_erc)*piVar1,(char (*) [9])"gmtime_r");
  }
  if (ptVar2 == in_RDI) {
    return (tm *)in_RDI;
  }
  assert_failed("res == &result",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/time.cpp"
                ,0x41);
}

Assistant:

struct std::tm gm_time (std::time_t const clock) {
        errno = 0;
        struct tm result {};
        struct tm * const res = gmtime_r (&clock, &result);
        if (res == nullptr) {
            raise (errno_erc{errno}, "gmtime_r");
        }
        PSTORE_ASSERT (res == &result);
        return result;
    }